

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_php_generator.cc
# Opt level: O2

void __thiscall
t_php_generator::generate_php_struct_reader
          (t_php_generator *this,ostream *out,t_struct *tstruct,bool is_result)

{
  int *piVar1;
  pointer pptVar2;
  t_field *tfield;
  t_type *ptVar3;
  bool bVar4;
  int iVar5;
  ostream *poVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  char *pcVar7;
  pointer pptVar8;
  t_field fftype;
  t_field ffid;
  string local_290;
  string local_270;
  string local_250;
  string local_230;
  string local_210;
  string local_1f0;
  string local_1d0;
  t_field local_1b0;
  string local_100;
  t_field local_e0;
  
  poVar6 = t_generator::indent((t_generator *)this,out);
  poVar6 = std::operator<<(poVar6,"public function read($input)");
  std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
  t_oop_generator::scope_up(&this->super_t_oop_generator,out);
  if (this->oop_ == true) {
    bVar4 = needs_php_read_validator(this,tstruct,is_result);
    poVar6 = t_generator::indent((t_generator *)this,out);
    if (bVar4) {
      poVar6 = std::operator<<(poVar6,"$tmp = $this->_read(\'");
      iVar5 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[3])(tstruct);
      poVar6 = std::operator<<(poVar6,(string *)CONCAT44(extraout_var,iVar5));
      poVar6 = std::operator<<(poVar6,"\', self::$_TSPEC, $input);");
      std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
      poVar6 = t_generator::indent((t_generator *)this,out);
      poVar6 = std::operator<<(poVar6,"$this->_validateForRead();");
      std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
      poVar6 = t_generator::indent((t_generator *)this,out);
      pcVar7 = "return $tmp;";
    }
    else {
      poVar6 = std::operator<<(poVar6,"return $this->_read(\'");
      iVar5 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[3])(tstruct);
      poVar6 = std::operator<<(poVar6,(string *)CONCAT44(extraout_var_00,iVar5));
      pcVar7 = "\', self::$_TSPEC, $input);";
    }
    poVar6 = std::operator<<(poVar6,pcVar7);
    std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
    t_oop_generator::scope_down(&this->super_t_oop_generator,out);
    std::operator<<(out,(string *)&::endl_abi_cxx11_);
    return;
  }
  t_generator::indent_abi_cxx11_((string *)&local_1b0,(t_generator *)this);
  poVar6 = std::operator<<(out,(string *)&local_1b0);
  poVar6 = std::operator<<(poVar6,"$xfer = 0;");
  poVar6 = std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_((string *)&local_e0,(t_generator *)this);
  poVar6 = std::operator<<(poVar6,(string *)&local_e0);
  poVar6 = std::operator<<(poVar6,"$fname = null;");
  poVar6 = std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_290,(t_generator *)this);
  poVar6 = std::operator<<(poVar6,(string *)&local_290);
  poVar6 = std::operator<<(poVar6,"$ftype = 0;");
  poVar6 = std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_270,(t_generator *)this);
  poVar6 = std::operator<<(poVar6,(string *)&local_270);
  poVar6 = std::operator<<(poVar6,"$fid = 0;");
  std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_270);
  std::__cxx11::string::~string((string *)&local_290);
  std::__cxx11::string::~string((string *)&local_e0);
  std::__cxx11::string::~string((string *)&local_1b0);
  if (this->binary_inline_ == false) {
    poVar6 = t_generator::indent((t_generator *)this,out);
    poVar6 = std::operator<<(poVar6,"$xfer += $input->readStructBegin($fname);");
    std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
  }
  poVar6 = t_generator::indent((t_generator *)this,out);
  poVar6 = std::operator<<(poVar6,"while (true) {");
  std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + 1;
  ptVar3 = g_type_i8;
  if (this->binary_inline_ == true) {
    std::__cxx11::string::string((string *)&local_1d0,"ftype",(allocator *)&local_e0);
    t_field::t_field(&local_1b0,ptVar3,&local_1d0);
    std::__cxx11::string::~string((string *)&local_1d0);
    ptVar3 = g_type_i16;
    std::__cxx11::string::string((string *)&local_1f0,"fid",(allocator *)&local_290);
    t_field::t_field(&local_e0,ptVar3,&local_1f0);
    std::__cxx11::string::~string((string *)&local_1f0);
    std::__cxx11::string::string((string *)&local_210,"",(allocator *)&local_290);
    generate_deserialize_field(this,out,&local_1b0,&local_210,false);
    std::__cxx11::string::~string((string *)&local_210);
    t_generator::indent_abi_cxx11_(&local_290,(t_generator *)this);
    poVar6 = std::operator<<(out,(string *)&local_290);
    poVar6 = std::operator<<(poVar6,"if ($ftype == ");
    poVar6 = std::operator<<(poVar6,"TType::STOP) {");
    poVar6 = std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
    t_generator::indent_abi_cxx11_(&local_270,(t_generator *)this);
    poVar6 = std::operator<<(poVar6,(string *)&local_270);
    poVar6 = std::operator<<(poVar6,"  break;");
    poVar6 = std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
    t_generator::indent_abi_cxx11_(&local_230,(t_generator *)this);
    poVar6 = std::operator<<(poVar6,(string *)&local_230);
    poVar6 = std::operator<<(poVar6,"}");
    std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_230);
    std::__cxx11::string::~string((string *)&local_270);
    std::__cxx11::string::~string((string *)&local_290);
    std::__cxx11::string::string((string *)&local_250,"",(allocator *)&local_290);
    generate_deserialize_field(this,out,&local_e0,&local_250,false);
    std::__cxx11::string::~string((string *)&local_250);
    t_field::~t_field(&local_e0);
    t_field::~t_field(&local_1b0);
  }
  else {
    poVar6 = t_generator::indent((t_generator *)this,out);
    poVar6 = std::operator<<(poVar6,"$xfer += $input->readFieldBegin($fname, $ftype, $fid);");
    std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
    poVar6 = t_generator::indent((t_generator *)this,out);
    poVar6 = std::operator<<(poVar6,"if ($ftype == ");
    poVar6 = std::operator<<(poVar6,"TType::STOP) {");
    std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
    piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
    *piVar1 = *piVar1 + 1;
    poVar6 = t_generator::indent((t_generator *)this,out);
    poVar6 = std::operator<<(poVar6,"break;");
    std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
    piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
    *piVar1 = *piVar1 + -1;
    poVar6 = t_generator::indent((t_generator *)this,out);
    poVar6 = std::operator<<(poVar6,"}");
    std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
  }
  poVar6 = t_generator::indent((t_generator *)this,out);
  poVar6 = std::operator<<(poVar6,"switch ($fid) {");
  std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + 1;
  pptVar8 = (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  while( true ) {
    pptVar2 = (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    poVar6 = t_generator::indent((t_generator *)this,out);
    if (pptVar8 == pptVar2) break;
    poVar6 = std::operator<<(poVar6,"case ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,(*pptVar8)->key_);
    poVar6 = std::operator<<(poVar6,":");
    std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
    piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
    *piVar1 = *piVar1 + 1;
    poVar6 = t_generator::indent((t_generator *)this,out);
    pcVar7 = "if ($ftype == ";
    poVar6 = std::operator<<(poVar6,"if ($ftype == ");
    type_to_enum_abi_cxx11_((string *)&local_1b0,(t_php_generator *)pcVar7,(*pptVar8)->type_);
    poVar6 = std::operator<<(poVar6,(string *)&local_1b0);
    poVar6 = std::operator<<(poVar6,") {");
    std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_1b0);
    piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
    *piVar1 = *piVar1 + 1;
    tfield = *pptVar8;
    std::__cxx11::string::string((string *)&local_100,"this->",(allocator *)&local_1b0);
    generate_deserialize_field(this,out,tfield,&local_100,false);
    std::__cxx11::string::~string((string *)&local_100);
    piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
    *piVar1 = *piVar1 + -1;
    t_generator::indent_abi_cxx11_((string *)&local_1b0,(t_generator *)this);
    poVar6 = std::operator<<(out,(string *)&local_1b0);
    poVar6 = std::operator<<(poVar6,"} else {");
    std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_1b0);
    piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
    *piVar1 = *piVar1 + 1;
    pcVar7 = "$xfer += $input->skip($ftype);";
    if (this->binary_inline_ != false) {
      pcVar7 = "$xfer += TProtocol::skipBinary($input, $ftype);";
    }
    poVar6 = t_generator::indent((t_generator *)this,out);
    poVar6 = std::operator<<(poVar6,pcVar7);
    std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
    piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
    *piVar1 = *piVar1 + -1;
    t_generator::indent_abi_cxx11_((string *)&local_1b0,(t_generator *)this);
    poVar6 = std::operator<<(out,(string *)&local_1b0);
    poVar6 = std::operator<<(poVar6,"}");
    poVar6 = std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
    t_generator::indent_abi_cxx11_((string *)&local_e0,(t_generator *)this);
    poVar6 = std::operator<<(poVar6,(string *)&local_e0);
    poVar6 = std::operator<<(poVar6,"break;");
    std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_e0);
    std::__cxx11::string::~string((string *)&local_1b0);
    piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
    *piVar1 = *piVar1 + -1;
    pptVar8 = pptVar8 + 1;
  }
  poVar6 = std::operator<<(poVar6,"default:");
  std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + 1;
  bVar4 = this->binary_inline_;
  poVar6 = t_generator::indent((t_generator *)this,out);
  if (bVar4 == true) {
    poVar6 = std::operator<<(poVar6,"$xfer += ");
    pcVar7 = "TProtocol::skipBinary($input, $ftype);";
  }
  else {
    pcVar7 = "$xfer += $input->skip($ftype);";
  }
  poVar6 = std::operator<<(poVar6,pcVar7);
  std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
  poVar6 = t_generator::indent((t_generator *)this,out);
  poVar6 = std::operator<<(poVar6,"break;");
  std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + -1;
  t_oop_generator::scope_down(&this->super_t_oop_generator,out);
  if (this->binary_inline_ == false) {
    poVar6 = t_generator::indent((t_generator *)this,out);
    poVar6 = std::operator<<(poVar6,"$xfer += $input->readFieldEnd();");
    std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
  }
  t_oop_generator::scope_down(&this->super_t_oop_generator,out);
  if (this->binary_inline_ == false) {
    poVar6 = t_generator::indent((t_generator *)this,out);
    poVar6 = std::operator<<(poVar6,"$xfer += $input->readStructEnd();");
    std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
  }
  bVar4 = needs_php_read_validator(this,tstruct,is_result);
  if (bVar4) {
    poVar6 = t_generator::indent((t_generator *)this,out);
    poVar6 = std::operator<<(poVar6,"$this->_validateForRead();");
    std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
  }
  poVar6 = t_generator::indent((t_generator *)this,out);
  poVar6 = std::operator<<(poVar6,"return $xfer;");
  std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + -1;
  t_generator::indent_abi_cxx11_((string *)&local_1b0,(t_generator *)this);
  poVar6 = std::operator<<(out,(string *)&local_1b0);
  poVar6 = std::operator<<(poVar6,"}");
  std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_1b0);
  return;
}

Assistant:

void t_php_generator::generate_php_struct_reader(ostream& out, t_struct* tstruct, bool is_result) {
  const vector<t_field*>& fields = tstruct->get_members();
  vector<t_field*>::const_iterator f_iter;

  indent(out) << "public function read($input)" << endl;
  scope_up(out);

  if (oop_) {
    if (needs_php_read_validator(tstruct, is_result)) {
      indent(out) << "$tmp = $this->_read('" << tstruct->get_name() << "', self::$_TSPEC, $input);"
                  << endl;
      indent(out) << "$this->_validateForRead();" << endl;
      indent(out) << "return $tmp;" << endl;
    } else {
      indent(out) << "return $this->_read('" << tstruct->get_name() << "', self::$_TSPEC, $input);"
                  << endl;
    }
    scope_down(out);
    out << endl;
    return;
  }

  out << indent() << "$xfer = 0;" << endl << indent() << "$fname = null;" << endl << indent()
      << "$ftype = 0;" << endl << indent() << "$fid = 0;" << endl;

  // Declare stack tmp variables
  if (!binary_inline_) {
    indent(out) << "$xfer += $input->readStructBegin($fname);" << endl;
  }

  // Loop over reading in fields
  indent(out) << "while (true) {" << endl;

  indent_up();

  // Read beginning field marker
  if (binary_inline_) {
    t_field fftype(g_type_i8, "ftype");
    t_field ffid(g_type_i16, "fid");
    generate_deserialize_field(out, &fftype);
    out << indent() << "if ($ftype == "
        << "TType::STOP) {" << endl << indent() << "  break;" << endl << indent() << "}" << endl;
    generate_deserialize_field(out, &ffid);
  } else {
    indent(out) << "$xfer += $input->readFieldBegin($fname, $ftype, $fid);" << endl;
    // Check for field STOP marker and break
    indent(out) << "if ($ftype == "
                << "TType::STOP) {" << endl;
    indent_up();
    indent(out) << "break;" << endl;
    indent_down();
    indent(out) << "}" << endl;
  }

  // Switch statement on the field we are reading
  indent(out) << "switch ($fid) {" << endl;

  indent_up();

  // Generate deserialization code for known cases
  for (f_iter = fields.begin(); f_iter != fields.end(); ++f_iter) {
    indent(out) << "case " << (*f_iter)->get_key() << ":" << endl;
    indent_up();
    indent(out) << "if ($ftype == " << type_to_enum((*f_iter)->get_type()) << ") {" << endl;
    indent_up();
    generate_deserialize_field(out, *f_iter, "this->");
    indent_down();
    out << indent() << "} else {" << endl;

    indent_up();
    if (binary_inline_) {
      indent(out) << "$xfer += TProtocol::skipBinary($input, $ftype);" << endl;
    } else {
      indent(out) << "$xfer += $input->skip($ftype);" << endl;
    }

    indent_down();
    out << indent() << "}" << endl << indent() << "break;" << endl;
    indent_down();
  }

  // In the default case we skip the field
  indent(out) << "default:" << endl;

  indent_up();
  if (binary_inline_) {
    indent(out) << "$xfer += "
                << "TProtocol::skipBinary($input, $ftype);" << endl;
  } else {
    indent(out) << "$xfer += $input->skip($ftype);" << endl;
  }
  indent(out) << "break;" << endl;
  indent_down();

  scope_down(out);

  if (!binary_inline_) {
    // Read field end marker
    indent(out) << "$xfer += $input->readFieldEnd();" << endl;
  }

  scope_down(out);

  if (!binary_inline_) {
    indent(out) << "$xfer += $input->readStructEnd();" << endl;
  }

  if (needs_php_read_validator(tstruct, is_result)) {
    indent(out) << "$this->_validateForRead();" << endl;
  }

  indent(out) << "return $xfer;" << endl;

  indent_down();
  out << indent() << "}" << endl;
}